

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

char * method_name(int method)

{
  char *pcVar1;
  
  if (method == 0) {
    pcVar1 = "Stored";
  }
  else if (method == 0x62) {
    pcVar1 = "PPMd";
  }
  else if (method == 0xc) {
    pcVar1 = "BZip2";
  }
  else if (method == 0xe) {
    pcVar1 = "LZMA";
  }
  else if (method == 8) {
    pcVar1 = "Deflate";
  }
  else {
    pcVar1 = method_name::unkn;
    sprintf(method_name::unkn,"Unk:%03d");
  }
  return pcVar1;
}

Assistant:

const char *method_name(int method)
{
	static char unkn[16];

	if (method == METHOD_STORED)
	{
		return "Stored";
	}
	if (method == METHOD_DEFLATE)
	{
		return "Deflate";
	}
	if (method == METHOD_LZMA)
	{
		return "LZMA";
	}
	if (method == METHOD_PPMD)
	{
		return "PPMd";
	}
	if (method == METHOD_BZIP2)
	{
		return "BZip2";
	}
	sprintf(unkn, "Unk:%03d", method);
	return unkn;
}